

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::resize
          (ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this,size_t size)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  
  pAVar2 = this->ptr + size;
  pAVar1 = this->pos;
  if (pAVar1 < pAVar2) {
    while (pAVar1 < pAVar2) {
      this->pos = pAVar1 + 1;
      pAVar1->ptr = (word *)0x0;
      pAVar1->size_ = 0;
      pAVar1 = this->pos;
    }
  }
  else {
    this->pos = pAVar2;
  }
  return;
}

Assistant:

void resize(size_t size) {
    KJ_IREQUIRE(size <= capacity(), "can't resize past capacity");

    T* target = ptr + size;
    if (target > pos) {
      // expand
      if (__has_trivial_constructor(T)) {
        pos = target;
      } else {
        while (pos < target) {
          kj::ctor(*pos++);
        }
      }
    } else {
      // truncate
      if (__has_trivial_destructor(T)) {
        pos = target;
      } else {
        while (pos > target) {
          kj::dtor(*--pos);
        }
      }
    }
  }